

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SimpleAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SimpleAssertionExpr,slang::ast::Expression_const&,std::optional<slang::ast::SequenceRepetition>&>
          (BumpAllocator *this,Expression *args,optional<slang::ast::SequenceRepetition> *args_1)

{
  SimpleAssertionExpr *this_00;
  optional<slang::ast::SequenceRepetition> *args_local_1;
  Expression *args_local;
  BumpAllocator *this_local;
  
  this_00 = (SimpleAssertionExpr *)allocate(this,0x30,8);
  ast::SimpleAssertionExpr::SimpleAssertionExpr
            (this_00,args,
             (optional<slang::ast::SequenceRepetition>)
             (args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>)._M_payload.
             super__Optional_payload_base<slang::ast::SequenceRepetition>);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }